

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall OrPattern::commonSubPattern(OrPattern *this,Pattern *b,int4 sa)

{
  bool bVar1;
  int iVar2;
  reference ppDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_50;
  DisjointPattern **local_48;
  DisjointPattern **local_40;
  Pattern *local_38;
  Pattern *next;
  Pattern *res;
  const_iterator iter;
  int4 sa_local;
  Pattern *b_local;
  OrPattern *this_local;
  
  iter._M_current._4_4_ = sa;
  __gnu_cxx::
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                       *)&res);
  local_40 = (DisjointPattern **)
             std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                       (&this->orlist);
  res = (Pattern *)local_40;
  ppDVar3 = __gnu_cxx::
            __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
            ::operator*((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                         *)&res);
  iVar2 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[6])(*ppDVar3,b,(ulong)iter._M_current._4_4_);
  next = (Pattern *)CONCAT44(extraout_var,iVar2);
  local_48 = (DisjointPattern **)
             __gnu_cxx::
             __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
             ::operator++((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                           *)&res,0);
  if (0 < (int)iter._M_current._4_4_) {
    iter._M_current._4_4_ = 0;
  }
  while( true ) {
    local_50._M_current =
         (DisjointPattern **)
         std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                        *)&res,&local_50);
    if (!bVar1) break;
    ppDVar3 = __gnu_cxx::
              __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
              ::operator*((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                           *)&res);
    iVar2 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[6])
                      (*ppDVar3,next,(ulong)iter._M_current._4_4_);
    local_38 = (Pattern *)CONCAT44(extraout_var_00,iVar2);
    if (next != (Pattern *)0x0) {
      (*next->_vptr_Pattern[1])();
    }
    next = local_38;
    __gnu_cxx::
    __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
    ::operator++((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                  *)&res);
  }
  return next;
}

Assistant:

Pattern *OrPattern::commonSubPattern(const Pattern *b,int4 sa) const

{
  vector<DisjointPattern *>::const_iterator iter;
  Pattern *res,*next;

  iter = orlist.begin();
  res = (*iter)->commonSubPattern(b,sa);
  iter++;

  if (sa > 0)
    sa = 0;
  while(iter!=orlist.end()) {
    next = (*iter)->commonSubPattern(res,sa);
    delete res;
    res = next;
    ++iter;
  }
  return res;
}